

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiffReporter.cpp
# Opt level: O0

void __thiscall ApprovalTests::DiffReporter::DiffReporter(DiffReporter *this)

{
  initializer_list<ApprovalTests::Reporter_*> __l;
  FirstWorkingReporter *this_00;
  Reporter *pRVar1;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *this_01;
  void *pvVar2;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *this_02;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *in_RDI;
  WindowsDiffReporter *in_stack_00000050;
  MacDiffReporter *in_stack_00000060;
  EnvironmentVariableReporter *in_stack_ffffffffffffff50;
  allocator_type *__a;
  iterator ppRVar3;
  Reporter *local_50;
  allocator_type local_48 [8];
  void *local_40;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *local_38;
  LinuxDiffReporter *in_stack_ffffffffffffffd0;
  
  this_00 = (FirstWorkingReporter *)operator_new(0x38);
  (((FirstWorkingReporter *)&this_00[1].super_Reporter)->super_Reporter)._vptr_Reporter =
       (_func_int **)0x0;
  this_00[1].reporters.
  super__Vector_base<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->reporters).
  super__Vector_base<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->reporters).
  super__Vector_base<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (((FirstWorkingReporter *)&this_00->super_Reporter)->super_Reporter)._vptr_Reporter =
       (_func_int **)0x0;
  (this_00->reporters).
  super__Vector_base<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  this_00[1].reporters.
  super__Vector_base<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  EnvironmentVariableReporter::EnvironmentVariableReporter(in_stack_ffffffffffffff50);
  ppRVar3 = &local_50;
  pRVar1 = (Reporter *)operator_new(0x20);
  Mac::MacDiffReporter::MacDiffReporter(in_stack_00000060);
  *ppRVar3 = pRVar1;
  __a = local_48;
  this_01 = (vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *)
            operator_new(0x20);
  Linux::LinuxDiffReporter::LinuxDiffReporter(in_stack_ffffffffffffffd0);
  *(vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> **)__a = this_01;
  pvVar2 = operator_new(0x20);
  Windows::WindowsDiffReporter::WindowsDiffReporter(in_stack_00000050);
  local_40 = pvVar2;
  this_02 = (vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *)
            operator_new(0x20);
  CrossPlatform::CrossPlatformDiffReporter::CrossPlatformDiffReporter
            ((CrossPlatformDiffReporter *)this_00);
  local_38 = this_02;
  ::std::allocator<ApprovalTests::Reporter_*>::allocator
            ((allocator<ApprovalTests::Reporter_*> *)0x1de3e5);
  __l._M_len = (size_type)pRVar1;
  __l._M_array = ppRVar3;
  ::std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::vector
            (this_01,__l,__a);
  FirstWorkingReporter::FirstWorkingReporter(this_00,in_RDI);
  ::std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::~vector
            (this_02);
  ::std::allocator<ApprovalTests::Reporter_*>::~allocator
            ((allocator<ApprovalTests::Reporter_*> *)0x1de434);
  (in_RDI->super__Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__DiffReporter_0027b8b0;
  return;
}

Assistant:

DiffReporter::DiffReporter()
        : FirstWorkingReporter({new EnvironmentVariableReporter(),
                                new Mac::MacDiffReporter(),
                                new Linux::LinuxDiffReporter(),
                                new Windows::WindowsDiffReporter(),
                                new CrossPlatform::CrossPlatformDiffReporter()})
    {
    }